

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_mt_test.cpp
# Opt level: O2

MPP_RET mt_test_ctx_init(MpiEncMtCtxInfo *info)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  MppCodingType MVar7;
  MppFrameFormat MVar8;
  undefined4 uVar9;
  MpiEncTestArgs *pMVar10;
  undefined4 uVar11;
  char *__s1;
  RK_S32 RVar12;
  RK_S32 RVar13;
  RK_S32 RVar14;
  int iVar15;
  FILE *pFVar16;
  CamSource *pCVar17;
  MppFrameFormat MVar18;
  uint uVar19;
  uint uVar20;
  MPP_RET MVar21;
  ulong uVar22;
  ulong uVar23;
  
  pMVar10 = info->cmd;
  uVar9 = pMVar10->width;
  uVar11 = pMVar10->height;
  (info->ctx).width = uVar9;
  (info->ctx).height = uVar11;
  uVar22._0_4_ = pMVar10->hor_stride;
  uVar22._4_4_ = pMVar10->ver_stride;
  uVar23 = CONCAT44(-(uint)(uVar22._4_4_ == 0),-(uint)((undefined4)uVar22 == 0));
  uVar22 = CONCAT44(uVar11 + 0xf,uVar9 + 0xf) & uVar23 & (ulong)DAT_00110020 | ~uVar23 & uVar22;
  (info->ctx).hor_stride = (int)uVar22;
  (info->ctx).ver_stride = (int)(uVar22 >> 0x20);
  (info->ctx).fmt = pMVar10->format;
  MVar7 = pMVar10->type;
  (info->ctx).type = MVar7;
  uVar3 = pMVar10->rc_mode;
  uVar4 = pMVar10->bps_target;
  uVar5 = pMVar10->bps_max;
  uVar6 = pMVar10->bps_min;
  (info->ctx).bps = uVar4;
  (info->ctx).bps_max = uVar5;
  (info->ctx).bps_min = uVar6;
  (info->ctx).rc_mode = uVar3;
  iVar15 = pMVar10->frame_num;
  (info->ctx).frame_num = iVar15;
  if (MVar7 == MPP_VIDEO_CodingMJPEG && iVar15 == 0) {
    _mpp_log_l(4,"mpi_enc_mt_test","jpege default encode only one frame. Use -n [num] for rc case\n"
               ,0);
    (info->ctx).frame_num = 1;
  }
  RVar12 = pMVar10->gop_len;
  (info->ctx).gop_mode = pMVar10->gop_mode;
  (info->ctx).gop_len = RVar12;
  (info->ctx).vi_len = pMVar10->vi_len;
  RVar12 = pMVar10->fps_in_num;
  RVar13 = pMVar10->fps_in_den;
  RVar14 = pMVar10->fps_out_flex;
  (info->ctx).fps_in_flex = pMVar10->fps_in_flex;
  (info->ctx).fps_in_den = RVar13;
  (info->ctx).fps_in_num = RVar12;
  (info->ctx).fps_out_flex = RVar14;
  uVar1 = pMVar10->fps_out_num;
  uVar2 = pMVar10->fps_out_den;
  (info->ctx).fps_out_den = uVar2;
  (info->ctx).fps_out_num = uVar1;
  __s1 = pMVar10->file_input;
  if (__s1 != (char *)0x0) {
    iVar15 = strncmp(__s1,"/dev/video",10);
    if (iVar15 == 0) {
      _mpp_log_l(4,"mpi_enc_mt_test","open camera device",0);
      pCVar17 = camera_source_init(pMVar10->file_input,4,(info->ctx).width,(info->ctx).height,
                                   (info->ctx).fmt);
      (info->ctx).cam_ctx = pCVar17;
      _mpp_log_l(4,"mpi_enc_mt_test","new framecap ok",0);
      if ((info->ctx).cam_ctx == (CamSource *)0x0) {
        _mpp_log_l(2,"mpi_enc_mt_test","open %s fail",0,pMVar10->file_input);
      }
    }
    else {
      pFVar16 = fopen(__s1,"rb");
      (info->ctx).fp_input = (FILE *)pFVar16;
      if (pFVar16 == (FILE *)0x0) {
        _mpp_log_l(2,"mpi_enc_mt_test","failed to open input file %s\n",0,pMVar10->file_input);
        _mpp_log_l(2,"mpi_enc_mt_test","create default yuv image for test\n",0);
      }
    }
  }
  MVar21 = MPP_OK;
  if (pMVar10->file_output != (char *)0x0) {
    pFVar16 = fopen(pMVar10->file_output,"w+b");
    (info->ctx).fp_output = (FILE *)pFVar16;
    if (pFVar16 == (FILE *)0x0) {
      _mpp_log_l(2,"mpi_enc_mt_test","failed to open output file %s\n",0,pMVar10->file_output);
      MVar21 = MPP_ERR_OPEN_FILE;
    }
  }
  if (pMVar10->file_slt != (char *)0x0) {
    pFVar16 = fopen(pMVar10->file_slt,"wt");
    (info->ctx).fp_verify = (FILE *)pFVar16;
    if (pFVar16 == (FILE *)0x0) {
      _mpp_log_l(2,"mpi_enc_mt_test","failed to open verify file %s\n",0,pMVar10->file_slt);
    }
  }
  MVar8 = (info->ctx).fmt;
  MVar18 = MVar8 & 0xfffff;
  if (MVar18 - MPP_FMT_RGB565 < 0xe) {
LAB_00106c16:
    uVar20 = (info->ctx).hor_stride + 0x3f & 0xffffffc0;
    uVar19 = (info->ctx).ver_stride + 0x3f & 0x3ffffc0;
  }
  else {
    if (MVar18 < MPP_FMT_YUV440SP) {
      if ((0xf44U >> (MVar8 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0) {
        uVar20 = (info->ctx).ver_stride + 0x3f & 0x7fffffc0;
        uVar19 = (info->ctx).hor_stride * 2 + 0x7e & 0x3ffff80;
        goto LAB_00106c68;
      }
      if ((0x11U >> (MVar8 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0) {
        uVar19 = ((info->ctx).ver_stride + 0x3f & 0xffffffc0) *
                 ((info->ctx).hor_stride + 0x3f & 0x3ffffc0) * 3 >> 1;
        goto LAB_00106c6b;
      }
      if (MVar18 == MPP_FMT_YUV400) goto LAB_00106c16;
    }
    uVar20 = (info->ctx).ver_stride + 0x3f & 0x3fffffc0;
    uVar19 = (info->ctx).hor_stride * 4 + 0xfc & 0x3ffff00;
  }
LAB_00106c68:
  uVar19 = uVar19 * uVar20;
LAB_00106c6b:
  (info->ctx).frame_size = (ulong)uVar19;
  if ((MVar8 & 0xf00000) == MPP_FMT_YUV420SP) {
    uVar19 = 0;
  }
  else {
    uVar19 = (((info->ctx).height + 0xf & 0xffffff0) * ((info->ctx).width + 0xf & 0xfffffff0) >> 4)
             + 0xfff & 0x1ffff000;
  }
  (info->ctx).header_size = (ulong)uVar19;
  return MVar21;
}

Assistant:

MPP_RET mt_test_ctx_init(MpiEncMtCtxInfo *info)
{
    MpiEncTestArgs *cmd = info->cmd;
    MpiEncMtTestData *p = &info->ctx;
    MPP_RET ret = MPP_OK;

    // get paramter from cmd
    p->width        = cmd->width;
    p->height       = cmd->height;
    p->hor_stride   = (cmd->hor_stride) ? (cmd->hor_stride) :
                      (MPP_ALIGN(cmd->width, 16));
    p->ver_stride   = (cmd->ver_stride) ? (cmd->ver_stride) :
                      (MPP_ALIGN(cmd->height, 16));
    p->fmt          = cmd->format;
    p->type         = cmd->type;
    p->bps          = cmd->bps_target;
    p->bps_min      = cmd->bps_min;
    p->bps_max      = cmd->bps_max;
    p->rc_mode      = cmd->rc_mode;
    p->frame_num    = cmd->frame_num;
    if (cmd->type == MPP_VIDEO_CodingMJPEG && p->frame_num == 0) {
        mpp_log("jpege default encode only one frame. Use -n [num] for rc case\n");
        p->frame_num = 1;
    }
    p->gop_mode     = cmd->gop_mode;
    p->gop_len      = cmd->gop_len;
    p->vi_len       = cmd->vi_len;

    p->fps_in_flex  = cmd->fps_in_flex;
    p->fps_in_den   = cmd->fps_in_den;
    p->fps_in_num   = cmd->fps_in_num;
    p->fps_out_flex = cmd->fps_out_flex;
    p->fps_out_den  = cmd->fps_out_den;
    p->fps_out_num  = cmd->fps_out_num;

    if (cmd->file_input) {
        if (!strncmp(cmd->file_input, "/dev/video", 10)) {
            mpp_log("open camera device");
            p->cam_ctx = camera_source_init(cmd->file_input, 4, p->width, p->height, p->fmt);
            mpp_log("new framecap ok");
            if (p->cam_ctx == NULL)
                mpp_err("open %s fail", cmd->file_input);
        } else {
            p->fp_input = fopen(cmd->file_input, "rb");
            if (NULL == p->fp_input) {
                mpp_err("failed to open input file %s\n", cmd->file_input);
                mpp_err("create default yuv image for test\n");
            }
        }
    }

    if (cmd->file_output) {
        p->fp_output = fopen(cmd->file_output, "w+b");
        if (NULL == p->fp_output) {
            mpp_err("failed to open output file %s\n", cmd->file_output);
            ret = MPP_ERR_OPEN_FILE;
        }
    }

    if (cmd->file_slt) {
        p->fp_verify = fopen(cmd->file_slt, "wt");
        if (!p->fp_verify)
            mpp_err("failed to open verify file %s\n", cmd->file_slt);
    }

    // update resource parameter
    switch (p->fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV420P: {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 3 / 2;
    } break;

    case MPP_FMT_YUV422_YUYV :
    case MPP_FMT_YUV422_YVYU :
    case MPP_FMT_YUV422_UYVY :
    case MPP_FMT_YUV422_VYUY :
    case MPP_FMT_YUV422P :
    case MPP_FMT_YUV422SP : {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 2;
    } break;
    case MPP_FMT_YUV400 :
    case MPP_FMT_RGB444 :
    case MPP_FMT_BGR444 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 :
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 :
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64);
    } break;

    default: {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 4;
    } break;
    }

    if (MPP_FRAME_FMT_IS_FBC(p->fmt))
        p->header_size = MPP_ALIGN(MPP_ALIGN(p->width, 16) * MPP_ALIGN(p->height, 16) / 16, SZ_4K);
    else
        p->header_size = 0;

    return ret;
}